

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

LineTable * __thiscall llvm::DWARFContext::getLineTableForUnit(DWARFContext *this,DWARFUnit *U)

{
  storage_type *ppLVar1;
  storage_type pLVar2;
  code *local_48 [2];
  code *local_38;
  code *local_30;
  undefined1 local_28 [8];
  Expected<const_llvm::DWARFDebugLine::LineTable_*> ExpectedLineTable;
  
  local_48[1] = (code *)0x0;
  local_48[0] = dumpWarning;
  local_30 = std::_Function_handler<void_(llvm::Error),_void_(*)(llvm::Error)>::_M_invoke;
  local_38 = std::_Function_handler<void_(llvm::Error),_void_(*)(llvm::Error)>::_M_manager;
  getLineTableForUnit((DWARFContext *)local_28,(DWARFUnit *)this,(function<void_(llvm::Error)> *)U);
  std::_Function_base::~_Function_base((_Function_base *)local_48);
  if ((ExpectedLineTable.field_0.TStorage.buffer[0] & 1U) == 0) {
    ppLVar1 = Expected<const_llvm::DWARFDebugLine::LineTable_*>::getStorage
                        ((Expected<const_llvm::DWARFDebugLine::LineTable_*> *)local_28);
    pLVar2 = *ppLVar1;
  }
  else {
    Expected<const_llvm::DWARFDebugLine::LineTable_*>::takeError
              ((Expected<const_llvm::DWARFDebugLine::LineTable_*> *)&ExpectedLineTable.field_0x8);
    dumpWarning((Error *)&ExpectedLineTable.field_0x8);
    if ((long *)(ExpectedLineTable._8_8_ & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(ExpectedLineTable._8_8_ & 0xfffffffffffffffe) + 8))();
    }
    pLVar2 = (storage_type)0x0;
  }
  Expected<const_llvm::DWARFDebugLine::LineTable_*>::~Expected
            ((Expected<const_llvm::DWARFDebugLine::LineTable_*> *)local_28);
  return pLVar2;
}

Assistant:

const DWARFDebugLine::LineTable *
DWARFContext::getLineTableForUnit(DWARFUnit *U) {
  Expected<const DWARFDebugLine::LineTable *> ExpectedLineTable =
      getLineTableForUnit(U, dumpWarning);
  if (!ExpectedLineTable) {
    dumpWarning(ExpectedLineTable.takeError());
    return nullptr;
  }
  return *ExpectedLineTable;
}